

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O0

void __thiscall xmrig::FailoverStrategy::add(FailoverStrategy *this,Pool *pool)

{
  IClient *__x;
  vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_> *in_RSI;
  long in_RDI;
  IClient *client;
  IClientListener *in_stack_00000030;
  int in_stack_0000003c;
  Pool *in_stack_00000040;
  
  std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::size
            ((vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_> *)(in_RDI + 0x30));
  __x = Pool::createClient(in_stack_00000040,in_stack_0000003c,in_stack_00000030);
  (*__x->_vptr_IClient[0x17])(__x,(ulong)*(uint *)(in_RDI + 0x14));
  (*__x->_vptr_IClient[0x18])(__x,(long)(*(int *)(in_RDI + 0x18) * 1000));
  (*__x->_vptr_IClient[0x16])(__x,(ulong)*(byte *)(in_RDI + 0x10) & 1);
  std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::push_back
            (in_RSI,(value_type *)__x);
  return;
}

Assistant:

void xmrig::FailoverStrategy::add(const Pool &pool)
{
    IClient *client = pool.createClient(static_cast<int>(m_pools.size()), this);

    client->setRetries(m_retries);
    client->setRetryPause(m_retryPause * 1000);
    client->setQuiet(m_quiet);

    m_pools.push_back(client);
}